

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createPerQuads<deqp::gls::GLValue::Half>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,Half min,
                 Half max)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  Half HVar4;
  int iVar5;
  Float<unsigned_int,_8,_23,_127,_3U> FVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  deUint32 u32;
  deRandom rnd;
  Float<unsigned_int,_8,_23,_127,_3U> local_b8;
  float local_b4;
  ulong local_b0;
  int local_a8;
  float local_a4;
  char *local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar5 = componentCount * 2;
  if (stride != 0) {
    iVar5 = stride;
  }
  local_a8 = iVar5 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    local_a8 = 0;
  }
  local_98 = (ulong)(uint)componentCount;
  local_a0 = (char *)operator_new__((long)(local_a8 * count));
  if (0 < count) {
    local_70 = (long)iVar5;
    local_78 = (long)(iVar5 * 2);
    local_80 = (long)(iVar5 * 3);
    local_88 = (long)(iVar5 << 2);
    local_90 = (long)(iVar5 * 5);
    local_68 = (ulong)(uint)count;
    local_60 = (local_98 & 0xffffffff) * 2;
    local_b0 = 0;
    do {
      pcVar3 = local_a0;
      if (0 < (int)local_98) {
        iVar5 = local_a8 * (int)local_b0;
        local_48 = local_a0 + local_70 + iVar5;
        local_50 = local_a0 + local_78 + iVar5;
        local_58 = local_a0 + local_80 + iVar5;
        lVar1 = local_88 + iVar5;
        lVar2 = local_90 + iVar5;
        lVar8 = 0;
        do {
          local_b8.m_value._0_2_ = (Half)max.m_value;
          local_b4 = (float)tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_b8);
          local_b8.m_value._0_2_ = min.m_value;
          FVar6 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                            ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_b8);
          HVar4.m_value = min.m_value;
          if ((float)FVar6.m_value <= local_b4) {
            local_b8.m_value._0_2_ = (Half)max.m_value;
            local_b4 = (float)tcu::Float<unsigned_int,8,23,127,3u>::
                              convert<unsigned_short,5,10,15,3u>
                                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_b8);
            local_b8.m_value._0_2_ = min.m_value;
            local_a4 = (float)tcu::Float<unsigned_int,8,23,127,3u>::
                              convert<unsigned_short,5,10,15,3u>
                                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_b8);
            fVar9 = deRandom_getFloat(&local_40);
            local_b8.m_value = (StorageType)((local_b4 - local_a4) * fVar9 + local_a4);
            HVar4.m_value =
                 (deFloat16)
                 tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_b8)
            ;
          }
          lVar7 = (long)(int)lVar8;
          *(deFloat16 *)(pcVar3 + lVar7 + iVar5) = HVar4.m_value;
          *(deFloat16 *)(local_48 + lVar7) = HVar4.m_value;
          *(deFloat16 *)(local_50 + lVar7) = HVar4.m_value;
          *(deFloat16 *)(local_58 + lVar7) = HVar4.m_value;
          *(deFloat16 *)(pcVar3 + lVar7 + lVar1) = HVar4.m_value;
          *(deFloat16 *)(pcVar3 + lVar7 + lVar2) = HVar4.m_value;
          lVar8 = lVar8 + 2;
        } while (local_60 != lVar8);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != local_68);
  }
  return local_a0;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}